

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

void __thiscall rengine::SDLBackend::dpi(SDLBackend *this)

{
  dpi((SDLBackend *)&this[-1].m_gl);
  return;
}

Assistant:

inline vec2 SDLBackend::dpi() const
{
    assert(m_window);
    assert(m_surface);
    int index = SDL_GetWindowDisplayIndex(m_window);
    float d, h, v;
    SDL_GetDisplayDPI(index, &d, &h, &v);
    return vec2(h, v) * devicePixelRatio();
}